

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jishmof.c
# Opt level: O0

void SaveFrame(AVFrame *pFrame,int width,int height,int iFrame)

{
  int local_4c;
  char local_48 [4];
  int y;
  char szFilename [32];
  FILE *pFile;
  int iFrame_local;
  int height_local;
  int width_local;
  AVFrame *pFrame_local;
  
  sprintf(local_48,"./output/frames/frame%d.ppm",(ulong)(uint)iFrame);
  szFilename._24_8_ = fopen(local_48,"wb");
  if ((FILE *)szFilename._24_8_ != (FILE *)0x0) {
    fprintf((FILE *)szFilename._24_8_,"P6\n%d %d\n255\n",(ulong)(uint)width,(ulong)(uint)height);
    for (local_4c = 0; local_4c < height; local_4c = local_4c + 1) {
      fwrite(pFrame->data[0] + local_4c * pFrame->linesize[0],1,(long)(width * 3),
             (FILE *)szFilename._24_8_);
    }
    fclose((FILE *)szFilename._24_8_);
  }
  return;
}

Assistant:

void SaveFrame(AVFrame *pFrame, int width, int height, int iFrame) {
  FILE *pFile;
  char szFilename[32];
  int  y;

  // Open file
  sprintf(szFilename, "./output/frames/frame%d.ppm", iFrame);
  pFile=fopen(szFilename, "wb");
  if(pFile==NULL)
    return;

  // Write header
  fprintf(pFile, "P6\n%d %d\n255\n", width, height);

  // Write pixel data
  for(y=0; y<height; y++)
    fwrite(pFrame->data[0]+y*pFrame->linesize[0], 1, width*3, pFile);

  // Close file
  fclose(pFile);
}